

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

int __thiscall MNS::Response::end(Response *this,char *data,uint dataLen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  void *pvVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  void *pvVar8;
  uint in_EDX;
  void *in_RSI;
  undefined1 *in_RDI;
  const_iterator header;
  string strDataLen;
  string msg;
  char *rb;
  Request *request;
  int offset;
  int ns;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var9;
  undefined8 in_stack_fffffffffffffef8;
  uint __val;
  key_type *in_stack_ffffffffffffff08;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff10;
  char *local_c8;
  iterator local_a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  iterator local_98;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [3];
  string local_78 [32];
  string local_58 [32];
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  long local_30;
  int local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  void *local_10;
  
  __val = (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (*(uint *)(in_RDI + 0x14) < in_EDX + 0x200) {
    local_1c = in_EDX + 0x200;
    local_20 = 0x1000;
    puVar4 = std::max<unsigned_int>(&local_1c,&local_20);
    local_18 = *puVar4;
    *(uint *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + local_18;
    pvVar5 = realloc(*(void **)(in_RDI + 0x20),(ulong)*(uint *)(in_RDI + 0x14));
    *(void **)(in_RDI + 0x20) = pvVar5;
  }
  local_24 = 0;
  local_30 = *(long *)(*(long *)(in_RDI + 0x58) + 8);
  local_38 = *(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               **)(in_RDI + 0x20);
  if (*(int *)(local_30 + 0x30) == 2) {
    local_c8 = "HTTP/1.1 ";
  }
  else {
    local_c8 = "HTTP/1.0 ";
  }
  local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mempcpy(local_38,local_c8,9);
  pmVar6 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::string(local_58,(string *)pmVar6);
  p_Var9 = local_38;
  pvVar5 = (void *)std::__cxx11::string::c_str();
  sVar7 = std::__cxx11::string::length();
  local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mempcpy(p_Var9,pvVar5,sVar7);
  iVar2 = std::__cxx11::string::length();
  local_24 = iVar2 + 9 + local_24;
  std::__cxx11::to_string(__val);
  local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mempcpy(local_38,"Content-Length",0xe);
  pvVar5 = mempcpy(local_38,": ",2);
  local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pvVar5;
  pvVar8 = (void *)std::__cxx11::string::c_str();
  sVar7 = std::__cxx11::string::length();
  local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mempcpy(pvVar5,pvVar8,sVar7);
  local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mempcpy(local_38,"\r\n",2);
  iVar2 = std::__cxx11::string::length();
  local_24 = local_24 + iVar2 + 0x12;
  if ((in_RDI[2] & 1) != 0) {
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)mempcpy(local_38,"Date",4);
    pvVar5 = mempcpy(local_38,": ",2);
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pvVar5;
    pvVar8 = (void *)std::__cxx11::string::c_str();
    sVar7 = std::__cxx11::string::length();
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)mempcpy(pvVar5,pvVar8,sVar7);
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)mempcpy(local_38,"\r\n",2);
    iVar2 = std::__cxx11::string::length();
    local_24 = local_24 + iVar2 + 8;
  }
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_fffffffffffffec8);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(local_90,&local_98);
  while( true ) {
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffec8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_a0,&local_a8);
    bVar1 = std::operator!=(local_90,&local_a0);
    if (!bVar1) break;
    p_Var9 = local_38;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1200b6);
    pvVar5 = (void *)std::__cxx11::string::c_str();
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1200d0);
    sVar7 = std::__cxx11::string::length();
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)mempcpy(p_Var9,pvVar5,sVar7);
    pvVar5 = mempcpy(local_38,": ",2);
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pvVar5;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x12012d);
    pvVar8 = (void *)std::__cxx11::string::c_str();
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x12014b);
    sVar7 = std::__cxx11::string::length();
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)mempcpy(pvVar5,pvVar8,sVar7);
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)mempcpy(local_38,"\r\n",2);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x12019f);
    iVar2 = std::__cxx11::string::length();
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1201b9);
    iVar3 = std::__cxx11::string::length();
    local_24 = local_24 + iVar2 + iVar3 + 4;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(p_Var9,in_stack_fffffffffffffed4);
  }
  local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mempcpy(local_38,"\r\n",2);
  local_24 = local_24 + 2;
  if (*(int *)(in_RDI + 0x10) != 0) {
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)mempcpy(local_38,*(void **)(in_RDI + 0x18),(ulong)*(uint *)(in_RDI + 0x10));
    local_24 = *(int *)(in_RDI + 0x10) + local_24;
  }
  if (local_10 != (void *)0x0) {
    local_38 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)mempcpy(local_38,local_10,(ulong)local_14);
    local_24 = local_14 + local_24;
  }
  *(int *)(in_RDI + 0x10) = local_24;
  iVar2 = uv_is_closing(*(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x20));
  if (iVar2 == 0) {
    uv_poll_start(*(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x20),2,Server::onWriteData);
  }
  *in_RDI = 1;
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return 0;
}

Assistant:

int MNS::Response::end(const char *data, unsigned int dataLen) {
//	int offset = std::sprintf(this->buffer, "HTTP/1.1 200 OK\r\nContent-Length: %u\r\n\r\n", (unsigned int) dataLen);
//	memcpy(this->buffer+offset, data, dataLen);
//
//	this->bufferLen = offset + dataLen;
//
//	uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
//	return 0;

	if(this->bufferSize < dataLen + 512) {
		int ns = std::max(dataLen + 512, (unsigned int)4096);
		this->bufferSize = this->bufferSize + ns;
		this->responseBuffer = (char *)realloc(this->responseBuffer, this->bufferSize);
	}

	int offset = 0;
	//this->setHeader(std::string("Date", 4), MNS::Server::currTime);
	//this->setHeader(std::string("Content-Length", 14), std::to_string(dataLen));

	MNS::Request *request = this->socketData->request;
	char *rb = this->responseBuffer;
	// First print the status code
	rb = (char *)mempcpy(rb, (request->httpVersion==HTTP_VERSION::HTTP_1_1)?"HTTP/1.1 ":"HTTP/1.0 ", 9);
	// Copy the response MSG
	std::string msg = MNS::Server::response_msgs[this->statusCode];
	rb = (char *)mempcpy(rb, msg.c_str(), msg.length());
	offset += msg.length() + 9;

	// Set the static headers

	// Content-Length
	std::string strDataLen = std::to_string(bufferLen + dataLen);
	rb = (char *)mempcpy(rb, "Content-Length", 14);
	rb = (char *)mempcpy(rb, ": ", 2);
	rb = (char *)mempcpy(rb, strDataLen.c_str(), strDataLen.length());
	rb = (char *)mempcpy(rb, "\r\n", 2);
	offset += strDataLen.length() + 18;

	// Date
	if(this->sendDate) {
		rb = (char *) mempcpy(rb, "Date", 4);
		rb = (char *) mempcpy(rb, ": ", 2);
		rb = (char *) mempcpy(rb, MNS::Server::currTime.c_str(), MNS::Server::currTime.length());
		rb = (char *) mempcpy(rb, "\r\n", 2);
		offset += MNS::Server::currTime.length() + 8;
	}

	// Copy the headers
	for(std::map<std::string, std::string>::const_iterator header = this->headers.begin(); header != this->headers.end(); header++) {
		rb = (char *)mempcpy(rb, header->first.c_str(), header->first.length());
		rb = (char *)mempcpy(rb, ": ", 2);
		rb = (char *)mempcpy(rb, header->second.c_str(), header->second.length());
		rb = (char *)mempcpy(rb, "\r\n", 2);
		offset += header->first.length() + header->second.length() + 4;
	}

	// Copy trailing line end
	rb = (char *)mempcpy(rb, "\r\n", 2);
	offset += 2;

	// Finally copy the buffer
	if(this->bufferLen) {
		rb = (char *)mempcpy(rb, this->buffer, this->bufferLen);
		offset += this->bufferLen;
	}

	// Copy the sent data
	if(data) {
		rb = (char *)mempcpy(rb, data, dataLen);
		offset += dataLen;
	}

	this->bufferLen = offset;

	if(!uv_is_closing((uv_handle_t*)this->socketData->poll_h))
		uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
	this->finished = true;

	return 0;

	/*
	MNS::Request *request = this->socketData->request;

	if(data) {
		//unsigned int dataLen = strlen(data);
		if(this->bufferSize - bufferLen < dataLen) {
			this->bufferSize = (dataLen>1024)?this->bufferSize + dataLen:this->bufferSize + 1024;
			this->buffer = (char *)realloc(this->buffer, this->bufferSize);
		}

		memcpy(this->buffer + this->bufferLen, data, dataLen);
		this->bufferLen += dataLen;
	}


	this->setHeader(std::string("Content-Length", 14), std::to_string(this->bufferLen));
	this->setHeader("Date", MNS::Server::currTime);

	response.append((request->httpVersion==HTTP_VERSION::HTTP_1_1)?"HTTP/1.1 ":"HTTP/1.0 ", 9);
	response.append(MNS::Server::response_msgs[this->statusCode]);

	for(std::map<std::string, std::string>::const_iterator header = this->headers.begin(); header != this->headers.end(); header++) {
		response.append(header->first);
		response.append(": ", 2);
		response.append(header->second);
		response.append("\r\n", 2);
	}

	response.append("\r\n", 2);
	response.append(this->buffer, this->bufferLen);

//	ssize_t numSent = send(this->socketData->fd, response.c_str(), response.length(), 0);
//	if(numSent == (int)response.length()) {
//		this->bufferLen = 0;
//		response.clear();
//		//uv_poll_start(handle, UV_READABLE, onReadData);
//	}
//	uv_poll_start(this->socketData->poll_h, UV_READABLE, MNS::Server::onReadData);
	uv_poll_start(this->socketData->poll_h, UV_WRITABLE, MNS::Server::onWriteData);
	this->finished = true;

	return 0;*/
}